

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objtracker.cpp
# Opt level: O3

void CObjectTracker::ReportHelper(string *label,CTracker *tracker,ostream *os)

{
  ulong uVar1;
  __int_type _Var2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  
  _Var2 = (tracker->NumAllocations).super___atomic_base<unsigned_long>._M_i;
  uVar3 = (tracker->NumReleases).super___atomic_base<unsigned_long>._M_i;
  uVar1 = (tracker->NumRetains).super___atomic_base<unsigned_long>._M_i + _Var2;
  if (uVar3 < uVar1) {
    pcVar6 = "Possible leak of type ";
    lVar5 = 0x16;
  }
  else {
    if (uVar3 <= uVar1) {
      if (_Var2 == 0) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"No ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(label->_M_dataplus)._M_p,label->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," leaks detected.",0x10);
      goto LAB_001989b2;
    }
    pcVar6 = "Unexpected counts for type ";
    lVar5 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(label->_M_dataplus)._M_p,label->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"    Number of Allocations: ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"    Number of Retains:     ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"    Number of Releases:    ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
LAB_001989b2:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void CObjectTracker::ReportHelper(
    const std::string& label,
    const CObjectTracker::CTracker& tracker,
    std::ostream& os )
{
    size_t  numAllocations = tracker.NumAllocations.load(std::memory_order_relaxed);
    size_t  numRetains = tracker.NumRetains.load(std::memory_order_relaxed);
    size_t  numReleases = tracker.NumReleases.load(std::memory_order_relaxed);

    if( numReleases < numAllocations + numRetains )
    {
        os << "Possible leak of type " << label << "!" << std::endl;
        os << "    Number of Allocations: " << numAllocations << std::endl;
        os << "    Number of Retains:     " << numRetains << std::endl;
        os << "    Number of Releases:    " << numReleases << std::endl;
    }
    else if( numReleases > numAllocations + numRetains )
    {
        // If there are more releases than allocations or retains then this
        // is an unexpected situation.  It usually means that some allocations
        // aren't tracked correctly, or that a retain or release returned
        // an error.
        os << "Unexpected counts for type " << label << "!" << std::endl;
        os << "    Number of Allocations: " << numAllocations << std::endl;
        os << "    Number of Retains:     " << numRetains << std::endl;
        os << "    Number of Releases:    " << numReleases << std::endl;
    }
    else if( numAllocations )
    {
        os << "No " << label << " leaks detected." << std::endl;
    }
}